

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_convolve.c
# Opt level: O1

void convolve_horiz(uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
                   InterpKernel *x_filters,int x0_q4,int x_step_q4,int w,int h)

{
  ulong uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  uint8_t uVar7;
  uint8_t *puVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar21 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined2 uVar22;
  
  if (0 < h) {
    puVar8 = src + -3;
    iVar9 = 0;
    do {
      if (0 < w) {
        uVar10 = 0;
        uVar11 = x0_q4;
        do {
          iVar13 = 0;
          iVar14 = 0;
          iVar15 = 0;
          iVar16 = 0;
          lVar12 = 0;
          do {
            uVar2 = *(undefined4 *)(puVar8 + lVar12 + ((int)uVar11 >> 4));
            uVar1 = (ulong)(ushort)uVar2 & 0xffffffffffff00ff;
            auVar3._8_4_ = 0;
            auVar3._0_8_ = uVar1;
            auVar3[0xc] = (char)((uint)uVar2 >> 0x18);
            auVar4[8] = (char)((uint)uVar2 >> 0x10);
            auVar4._0_8_ = uVar1;
            auVar4[9] = 0;
            auVar4._10_3_ = auVar3._10_3_;
            auVar6._5_8_ = 0;
            auVar6._0_5_ = auVar4._8_5_;
            auVar21._0_4_ = (undefined4)uVar1;
            auVar5[4] = (char)((uint)uVar2 >> 8);
            auVar5._0_4_ = auVar21._0_4_;
            auVar5[5] = 0;
            auVar5._6_7_ = SUB137(auVar6 << 0x40,6);
            auVar21._4_9_ = auVar5._4_9_;
            auVar21._13_3_ = 0;
            uVar1 = *(ulong *)((long)*x_filters + lVar12 * 2 + (ulong)((uVar11 & 0xf) << 4));
            uVar22 = (undefined2)(uVar1 >> 0x30);
            auVar20._8_4_ = 0;
            auVar20._0_8_ = uVar1;
            auVar20._12_2_ = uVar22;
            auVar20._14_2_ = uVar22;
            uVar22 = (undefined2)(uVar1 >> 0x20);
            auVar19._12_4_ = auVar20._12_4_;
            auVar19._8_2_ = 0;
            auVar19._0_8_ = uVar1;
            auVar19._10_2_ = uVar22;
            auVar18._10_6_ = auVar19._10_6_;
            auVar18._8_2_ = uVar22;
            auVar18._0_8_ = uVar1;
            uVar22 = (undefined2)(uVar1 >> 0x10);
            auVar17._8_8_ = auVar18._8_8_;
            auVar17._6_2_ = uVar22;
            auVar17._4_2_ = uVar22;
            auVar17._0_2_ = (undefined2)uVar1;
            auVar17._2_2_ = auVar17._0_2_;
            auVar21 = pmaddwd(auVar17,auVar21);
            iVar13 = iVar13 + auVar21._0_4_;
            iVar14 = iVar14 + auVar21._4_4_;
            iVar15 = iVar15 + auVar21._8_4_;
            iVar16 = iVar16 + auVar21._12_4_;
            lVar12 = lVar12 + 4;
          } while (lVar12 != 8);
          iVar13 = iVar16 + iVar14 + iVar15 + iVar13 + 0x40 >> 7;
          if (iVar13 < 1) {
            iVar13 = 0;
          }
          uVar7 = (uint8_t)iVar13;
          if (0xfe < iVar13) {
            uVar7 = 0xff;
          }
          dst[uVar10] = uVar7;
          uVar11 = uVar11 + x_step_q4;
          uVar10 = uVar10 + 1;
        } while (uVar10 != (uint)w);
      }
      puVar8 = puVar8 + src_stride;
      dst = dst + dst_stride;
      iVar9 = iVar9 + 1;
    } while (iVar9 != h);
  }
  return;
}

Assistant:

static void convolve_horiz(const uint8_t *src, ptrdiff_t src_stride,
                           uint8_t *dst, ptrdiff_t dst_stride,
                           const InterpKernel *x_filters, int x0_q4,
                           int x_step_q4, int w, int h) {
  src -= SUBPEL_TAPS / 2 - 1;
  for (int y = 0; y < h; ++y) {
    int x_q4 = x0_q4;
    for (int x = 0; x < w; ++x) {
      const uint8_t *const src_x = &src[x_q4 >> SUBPEL_BITS];
      const int16_t *const x_filter = x_filters[x_q4 & SUBPEL_MASK];
      const int sum = horz_scalar_product(src_x, x_filter);
      dst[x] = clip_pixel(ROUND_POWER_OF_TWO(sum, FILTER_BITS));
      x_q4 += x_step_q4;
    }
    src += src_stride;
    dst += dst_stride;
  }
}